

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

Token * __thiscall llvm::yaml::Node::getNext(Token *__return_storage_ptr__,Node *this)

{
  pointer this_00;
  Node *this_local;
  
  this_00 = std::unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>::
            operator->(this->Doc);
  Document::getNext(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

Token Node::getNext() {
  return Doc->getNext();
}